

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptProxy::GetAccessors
          (JavascriptProxy *this,PropertyId propertyId,Var *getter,Var *setter,
          ScriptContext *requestContext)

{
  bool bVar1;
  Var pvVar2;
  bool local_71;
  uint local_64;
  undefined1 local_60 [4];
  BOOL foundProperty;
  PropertyDescriptor result;
  ScriptContext *requestContext_local;
  Var *setter_local;
  Var *getter_local;
  PropertyId propertyId_local;
  JavascriptProxy *this_local;
  
  result._40_8_ = requestContext;
  PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_60);
  if (getter != (Var *)0x0) {
    *getter = (Var)0x0;
  }
  if (setter != (Var *)0x0) {
    *setter = (Var)0x0;
  }
  local_64 = GetOwnPropertyDescriptor
                       ((RecyclableObject *)this,propertyId,(ScriptContext *)result._40_8_,
                        (PropertyDescriptor *)local_60);
  if ((local_64 != 0) &&
     (bVar1 = PropertyDescriptor::IsFromProxy((PropertyDescriptor *)local_60), bVar1)) {
    bVar1 = PropertyDescriptor::GetterSpecified((PropertyDescriptor *)local_60);
    if ((bVar1) && (getter != (Var *)0x0)) {
      pvVar2 = PropertyDescriptor::GetGetter((PropertyDescriptor *)local_60);
      *getter = pvVar2;
    }
    bVar1 = PropertyDescriptor::SetterSpecified((PropertyDescriptor *)local_60);
    if ((bVar1) && (setter != (Var *)0x0)) {
      pvVar2 = PropertyDescriptor::GetSetter((PropertyDescriptor *)local_60);
      *setter = pvVar2;
    }
    bVar1 = PropertyDescriptor::GetterSpecified((PropertyDescriptor *)local_60);
    local_71 = true;
    if (!bVar1) {
      local_71 = PropertyDescriptor::SetterSpecified((PropertyDescriptor *)local_60);
    }
    local_64 = (uint)local_71;
  }
  return local_64;
}

Assistant:

BOOL JavascriptProxy::GetAccessors(PropertyId propertyId, _Outptr_result_maybenull_ Var* getter, _Outptr_result_maybenull_ Var* setter, ScriptContext* requestContext)
    {
        PropertyDescriptor result;
        if (getter != nullptr)
        {
            *getter = nullptr;
        }

        if (setter != nullptr)
        {
            *setter = nullptr;
        }

        BOOL foundProperty = GetOwnPropertyDescriptor(this, propertyId, requestContext, &result);
        if (foundProperty && result.IsFromProxy())
        {
            if (result.GetterSpecified() && getter != nullptr)
            {
                *getter = result.GetGetter();
            }
            if (result.SetterSpecified() && setter != nullptr)
            {
                *setter = result.GetSetter();
            }
            foundProperty = result.GetterSpecified() || result.SetterSpecified();
        }
        return foundProperty;
    }